

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_dump(lua_State *L,lua_Writer writer,void *data,int strip)

{
  int iVar1;
  
  if (L->top[-1].tt_ == 0x46) {
    iVar1 = luaU_dump(L,*(Proto **)(L->top[-1].value_.f + 0x18),writer,data,strip);
    return iVar1;
  }
  return 1;
}

Assistant:

LUA_API int lua_dump (lua_State *L, lua_Writer writer, void *data, int strip) {
  int status;
  TValue *o;
  lua_lock(L);
  api_checknelems(L, 1);
  o = L->top - 1;
  if (isLfunction(o))
    status = luaU_dump(L, getproto(o), writer, data, strip);
  else
    status = 1;
  lua_unlock(L);
  return status;
}